

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

void __thiscall
TasGrid::GridGlobal::evaluateHierarchicalFunctions(GridGlobal *this,double *x,int num_x,double *y)

{
  bool bVar1;
  double *pdVar2;
  double *pdVar3;
  int local_6c;
  int local_60;
  int i;
  undefined1 local_50 [8];
  Wrapper2D<double> ywrap;
  Wrapper2D<const_double> xwrap;
  int num_points;
  double *y_local;
  int num_x_local;
  double *x_local;
  GridGlobal *this_local;
  
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (bVar1) {
    local_6c = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).needed);
  }
  else {
    local_6c = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  }
  Utils::Wrapper2D<const_double>::Wrapper2D
            ((Wrapper2D<const_double> *)&ywrap.data,(this->super_BaseCanonicalGrid).num_dimensions,x
            );
  Utils::Wrapper2D<double>::Wrapper2D((Wrapper2D<double> *)local_50,local_6c,y);
  for (local_60 = 0; local_60 < num_x; local_60 = local_60 + 1) {
    pdVar2 = Utils::Wrapper2D<const_double>::getStrip
                       ((Wrapper2D<const_double> *)&ywrap.data,local_60);
    pdVar3 = Utils::Wrapper2D<double>::getStrip((Wrapper2D<double> *)local_50,local_60);
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0xd])(this,pdVar2,pdVar3);
  }
  Utils::Wrapper2D<double>::~Wrapper2D((Wrapper2D<double> *)local_50);
  Utils::Wrapper2D<const_double>::~Wrapper2D((Wrapper2D<const_double> *)&ywrap.data);
  return;
}

Assistant:

void GridGlobal::evaluateHierarchicalFunctions(const double x[], int num_x, double y[]) const{
    int num_points = (points.empty()) ? needed.getNumIndexes() : points.getNumIndexes();
    Utils::Wrapper2D<const double> xwrap(num_dimensions, x);
    Utils::Wrapper2D<double> ywrap(num_points, y);
    #pragma omp parallel for
    for(int i=0; i<num_x; i++)
        getInterpolationWeights(xwrap.getStrip(i), ywrap.getStrip(i));
}